

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.h
# Opt level: O1

Name __thiscall wasm::TranslateToFuzzReader::makeLabel(TranslateToFuzzReader *this)

{
  size_type *psVar1;
  long *plVar2;
  ulong uVar3;
  uint __val;
  undefined8 uVar4;
  bool bVar5;
  char cVar6;
  char cVar7;
  undefined8 *puVar8;
  uint uVar9;
  ulong uVar10;
  Name NVar11;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  size_type *local_68;
  string __str;
  long local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"label$","");
  __val = this->funcContext->labelIndex;
  this->funcContext->labelIndex = __val + 1;
  cVar7 = '\x01';
  if (9 < __val) {
    uVar9 = __val;
    cVar6 = '\x04';
    do {
      cVar7 = cVar6;
      if (uVar9 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_0015cf33;
      }
      if (uVar9 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_0015cf33;
      }
      if (uVar9 < 10000) goto LAB_0015cf33;
      bVar5 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar6 = cVar7 + '\x04';
    } while (bVar5);
    cVar7 = cVar7 + '\x01';
  }
LAB_0015cf33:
  psVar1 = &__str._M_string_length;
  local_68 = psVar1;
  std::__cxx11::string::_M_construct((ulong)&local_68,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_68,(uint)__str._M_dataplus._M_p,__val);
  uVar3 = CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p) + local_80;
  uVar10 = 0xf;
  if (local_88 != local_78) {
    uVar10 = local_78[0];
  }
  if (uVar10 < uVar3) {
    uVar10 = 0xf;
    if (local_68 != psVar1) {
      uVar10 = __str._M_string_length;
    }
    if (uVar3 <= uVar10) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_88);
      goto LAB_0015cfaa;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_68);
LAB_0015cfaa:
  __str.field_2._8_8_ = &local_38;
  plVar2 = puVar8 + 2;
  if ((long *)*puVar8 == plVar2) {
    local_38 = *plVar2;
    uStack_30 = *(undefined4 *)(puVar8 + 3);
    uStack_2c = *(undefined4 *)((long)puVar8 + 0x1c);
  }
  else {
    local_38 = *plVar2;
    __str.field_2._8_8_ = (long *)*puVar8;
  }
  uVar4 = puVar8[1];
  *puVar8 = plVar2;
  puVar8[1] = 0;
  *(undefined1 *)plVar2 = 0;
  NVar11.super_IString.str = (IString)wasm::IString::interned(uVar4,__str.field_2._8_8_,0);
  if ((long *)__str.field_2._8_8_ != &local_38) {
    operator_delete((void *)__str.field_2._8_8_,local_38 + 1);
  }
  if (local_68 != psVar1) {
    operator_delete(local_68,__str._M_string_length + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  return (Name)NVar11.super_IString.str;
}

Assistant:

Name makeLabel() {
    return std::string("label$") + std::to_string(funcContext->labelIndex++);
  }